

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int VP8LDecodeAlphaImageStream(ALPHDecoder *alph_dec,int last_row)

{
  int in_ESI;
  long in_RDI;
  VP8LDecoder *dec;
  int in_stack_0000004c;
  int in_stack_00000050;
  int in_stack_00000054;
  uint8_t *in_stack_00000058;
  VP8LDecoder *in_stack_00000060;
  ProcessRowsFunc in_stack_00000088;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  uint32_t *in_stack_000000a0;
  VP8LDecoder *in_stack_000000a8;
  undefined4 local_24;
  undefined4 local_4;
  
  if (*(int *)(*(long *)(in_RDI + 0x18) + 0x8c) < in_ESI) {
    if (*(int *)(in_RDI + 0xc0) == 0) {
      WebPInitAlphaProcessing();
    }
    if (*(int *)(in_RDI + 0xc0) == 0) {
      local_24 = DecodeImageData(in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,
                                 in_stack_00000098,in_stack_00000094,in_stack_00000088);
    }
    else {
      local_24 = DecodeAlphaData(in_stack_00000060,in_stack_00000058,in_stack_00000054,
                                 in_stack_00000050,in_stack_0000004c);
    }
    local_4 = local_24;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int VP8LDecodeAlphaImageStream(ALPHDecoder* const alph_dec, int last_row) {
  VP8LDecoder* const dec = alph_dec->vp8l_dec_;
  assert(dec != NULL);
  assert(last_row <= dec->height_);

  if (dec->last_row_ >= last_row) {
    return 1;  // done
  }

  if (!alph_dec->use_8b_decode_) WebPInitAlphaProcessing();

  // Decode (with special row processing).
  return alph_dec->use_8b_decode_ ?
      DecodeAlphaData(dec, (uint8_t*)dec->pixels_, dec->width_, dec->height_,
                      last_row) :
      DecodeImageData(dec, dec->pixels_, dec->width_, dec->height_,
                      last_row, ExtractAlphaRows);
}